

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPrerequisiteTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::PrerequisiteTests::init(PrerequisiteTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  ClearColorCase *this_00;
  ReadPixelsCase *this_01;
  
  node = (TestNode *)operator_new(0x78);
  StateResetCase::StateResetCase((StateResetCase *)node,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,node);
  this_00 = (ClearColorCase *)operator_new(0x88);
  ClearColorCase::ClearColorCase(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (ReadPixelsCase *)operator_new(0x80);
  ReadPixelsCase::ReadPixelsCase(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void PrerequisiteTests::init (void)
{
	addChild(new StateResetCase(m_context));
	addChild(new ClearColorCase(m_context));
	addChild(new ReadPixelsCase(m_context));
}